

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.cpp
# Opt level: O2

bool __thiscall rc::detail::AdapterContext::reportResult(AdapterContext *this,CaseResult *result)

{
  Type TVar1;
  
  TVar1 = result->type;
  if (TVar1 == Success) {
    if (this->m_resultType == Success) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&this->m_messages);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->m_messages,&result->description);
    }
  }
  else if (TVar1 == Failure) {
    if (this->m_resultType != Discard) {
      if (this->m_resultType == Success) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear(&this->m_messages);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->m_messages,&result->description);
      this->m_resultType = Failure;
    }
  }
  else if ((TVar1 == Discard) && (this->m_resultType != Discard)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&this->m_messages);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->m_messages,&result->description);
    this->m_resultType = Discard;
  }
  return true;
}

Assistant:

bool AdapterContext::reportResult(const CaseResult &result) {
  switch (result.type) {
  case CaseResult::Type::Discard:
    // Discard overrides all, no previous result is valid. However, we're only
    // interested in the first discard.
    if (m_resultType != CaseResult::Type::Discard) {
      m_messages.clear();
      m_messages.push_back(result.description);
      m_resultType = CaseResult::Type::Discard;
    }
    break;

  case CaseResult::Type::Failure:
    // Discard overrides failure so ignore this failure if already discarded.
    if (m_resultType != CaseResult::Type::Discard) {
      if (m_resultType == CaseResult::Type::Success) {
        // Previous type was success, clear any success messages because now we
        // are in failure mode
        m_messages.clear();
      }

      m_messages.push_back(result.description);
      m_resultType = CaseResult::Type::Failure;
    }
    break;

  case CaseResult::Type::Success:
    if (m_resultType == CaseResult::Type::Success) {
      // We only keep the last success message and we're only insterested if we
      // haven't failed
      m_messages.clear();
      m_messages.push_back(result.description);
    }
    break;
  }

  return true;
}